

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_graph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
          *skel_graph)

{
  Dictionary *this_00;
  Vertex_handle VVar1;
  pointer psVar2;
  Dictionary_it DVar3;
  size_t sVar4;
  Siblings *pSVar5;
  invalid_argument *this_01;
  pointer ppVar6;
  type tmp;
  adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
  *paVar7;
  AdjList *g;
  pointer psVar8;
  long lVar9;
  Dictionary_it sh;
  Dictionary_it it;
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>
  local_b8;
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>
  local_98;
  undefined1 local_78 [8];
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  verts;
  
  sVar4 = num_simplices(this);
  if (sVar4 != 0) {
    __assert_fail("num_simplices() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x5d5,
                  "void Gudhi::Simplex_tree<>::insert_graph(const OneSkeletonGraph &) [SimplexTreeOptions = Gudhi::Simplex_tree_options_default, OneSkeletonGraph = boost::adjacency_list<boost::setS, boost::vecS, boost::undirectedS, boost::property<Gudhi::vertex_filtration_t, double>, boost::property<Gudhi::edge_filtration_t, double>>]"
                 );
  }
  lVar9 = (long)(skel_graph->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(skel_graph->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    this->dimension_ =
         (uint)((skel_graph->super_type).m_edges.
                super__List_base<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>_>
                ._M_impl._M_node._M_size != 0);
    this_00 = &(this->root_).members_;
    boost::container::
    vector<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_void>
    ::reserve((vector<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_void>
               *)this_00,lVar9 >> 6);
    it.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                *)0x0;
    sh.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                *)this;
    boost::range_detail::operator|
              (&verts,(pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>
                       *)&it,
               (transform_holder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70)>
                *)&sh);
    local_b8.super_type =
         (type)(type)verts.
                     super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                     .
                     super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                     .
                     super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                     .m_Begin.super_type.m_iterator.m_value;
    local_b8.m_f.m_impl.super_type.m_initialized =
         verts.
         super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin.m_f.m_impl.super_type.m_initialized == true;
    if (local_b8.m_f.m_impl.super_type.m_initialized) {
      local_b8.m_f.m_impl.super_type.m_storage.dummy_.aligner_ =
           verts.
           super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin.m_f.m_impl.super_type.m_storage.dummy_.aligner_;
      local_b8.m_f.m_impl.super_type.m_storage.dummy_._8_8_ =
           verts.
           super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin.m_f.m_impl.super_type.m_storage.dummy_._8_8_;
    }
    local_98.super_type =
         (type)(type)verts.
                     super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                     .
                     super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                     .
                     super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                     .m_End.super_type.m_iterator.m_value;
    local_98.m_f.m_impl.super_type.m_initialized =
         verts.
         super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
         .
         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
         .m_End.m_f.m_impl.super_type.m_initialized == true;
    if (local_98.m_f.m_impl.super_type.m_initialized) {
      local_98.m_f.m_impl.super_type.m_storage.dummy_.aligner_ =
           verts.
           super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
           .m_End.m_f.m_impl.super_type.m_storage.dummy_.aligner_;
      local_98.m_f.m_impl.super_type.m_storage.dummy_._8_8_ =
           verts.
           super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
           .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_;
    }
    boost::container::
    flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>
    ::
    insert<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::insert_graph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>>(boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>const&)::_lambda(auto:1)_1_,std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>,boost::range_detail::integer_iterator<unsigned_long>,boost::use_default,boost::use_default>>
              ((flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>
                *)this_00,&local_b8,&local_98);
    if (local_98.m_f.m_impl.super_type.m_initialized == true) {
      local_98.m_f.m_impl.super_type.m_initialized = false;
    }
    if (local_b8.m_f.m_impl.super_type.m_initialized == true) {
      local_b8.m_f.m_impl.super_type.m_initialized = false;
    }
    ppVar6 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    it.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                *)ppVar6;
    while (it.m_ptr !=
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
            *)(ppVar6 + (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size)) {
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
      ::operator++(&sh,(int)&it);
      ppVar6 = (this_00->m_flat_tree).m_data.m_seq.m_holder.m_start;
    }
    paVar7 = skel_graph;
    while (paVar7 = (adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
                     *)(paVar7->super_type).m_edges.
                       super__List_base<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next, paVar7 != skel_graph) {
      psVar8 = (pointer)(paVar7->super_type).m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>_>
                        ._M_impl._M_node._M_size;
      psVar2 = (paVar7->super_type).m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (psVar8 == psVar2) {
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_01,"Self-loops are not simplicial");
        __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if (psVar8 < psVar2) {
        psVar8 = psVar2;
      }
      find_vertex((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_78,(Vertex_handle)this)
      ;
      _to_node_it((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sh,(Simplex_handle *)this);
      DVar3 = sh;
      pSVar5 = ((sh.m_ptr)->second).children_;
      if (pSVar5->parent_ != (sh.m_ptr)->first) {
        pSVar5 = (Siblings *)operator_new(0x28);
        VVar1 = (DVar3.m_ptr)->first;
        pSVar5->oncles_ = &this->root_;
        pSVar5->parent_ = VVar1;
        (pSVar5->members_).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
        (pSVar5->members_).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
        (pSVar5->members_).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
        ((DVar3.m_ptr)->second).children_ = pSVar5;
      }
      insert_node_<false,false,false,double_const&>
                ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&it,(Siblings *)this,
                 (Vertex_handle)pSVar5,(double *)((ulong)psVar8 & 0xffffffff));
    }
  }
  return;
}

Assistant:

void insert_graph(const OneSkeletonGraph& skel_graph) {
    // the simplex tree must be empty
    assert(num_simplices() == 0);

    // is there a better way to let the compiler know that we don't mean Simplex_tree::num_vertices?
    using boost::num_vertices;

    if (num_vertices(skel_graph) == 0) {
      return;
    }
    if (num_edges(skel_graph) == 0) {
      dimension_ = 0;
    } else {
      dimension_ = 1;
    }

    if constexpr (!Options::stable_simplex_handles)
      root_.members_.reserve(num_vertices(skel_graph)); // probably useless in most cases
    auto verts = vertices(skel_graph) | boost::adaptors::transformed([&](auto v){
        return Dit_value_t(v, Node(&root_, get(vertex_filtration_t(), skel_graph, v))); });
    root_.members_.insert(boost::begin(verts), boost::end(verts));
    // This automatically sorts the vertices, the graph concept doesn't guarantee the order in which we iterate.

    for (Dictionary_it it = boost::begin(root_.members_); it != boost::end(root_.members_); it++) {
      update_simplex_tree_after_node_insertion(it);
    }

    std::pair<typename boost::graph_traits<OneSkeletonGraph>::edge_iterator,
              typename boost::graph_traits<OneSkeletonGraph>::edge_iterator> boost_edges = edges(skel_graph);
    // boost_edges.first is the equivalent to boost_edges.begin()
    // boost_edges.second is the equivalent to boost_edges.end()
    for (; boost_edges.first != boost_edges.second; boost_edges.first++) {
      auto edge = *(boost_edges.first);
      auto u = source(edge, skel_graph);
      auto v = target(edge, skel_graph);
      if (u == v) throw std::invalid_argument("Self-loops are not simplicial");
      // We cannot skip edges with the wrong orientation and expect them to
      // come a second time with the right orientation, that does not always
      // happen in practice. emplace() should be a NOP when an element with the
      // same key is already there, so seeing the same edge multiple times is
      // ok.
      // Should we actually forbid multiple edges? That would be consistent
      // with rejecting self-loops.
      if (v < u) std::swap(u, v);
      auto sh = _to_node_it(find_vertex(u));
      if (!has_children(sh)) {
        sh->second.assign_children(new Siblings(&root_, sh->first));
      }

      insert_node_<false, false, false>(sh->second.children(), v, get(edge_filtration_t(), skel_graph, edge));
    }
  }